

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

bool IsChildWithParents(Package *package)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  size_type sVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  anon_class_8_1_13d0ef5f __pred;
  _Node_iterator_base<uint256,_true> __first;
  long in_FS_OFFSET;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  iVar7;
  value_type *child;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  input_txids;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffed8;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  _Node_iterator_base<uint256,_true> in_stack_fffffffffffffef8;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __last;
  bool local_59;
  shared_ptr<const_CTransaction> local_50 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffee0);
  cVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffee0);
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__0>
                    (cVar2._M_current,cVar3._M_current);
  if (!bVar1) {
    __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/packages.cpp"
                  ,0x79,"bool IsChildWithParents(const Package &)");
  }
  sVar4 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffed8);
  if (sVar4 < 2) {
    local_59 = false;
  }
  else {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffed8);
    __last._M_current = local_50;
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                     *)in_stack_fffffffffffffed8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(in_stack_fffffffffffffed8);
    cVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::cbegin
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffee0);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(in_stack_fffffffffffffed8);
    cVar6 = std::vector<CTxIn,_std::allocator<CTxIn>_>::cend
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffee0);
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::end(in_stack_fffffffffffffee0);
    iVar7 = std::
            inserter<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                      ((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                        *)CONCAT17(in_stack_fffffffffffffeef,
                                   CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                       (__range_iter_t<std::unordered_set<uint256,_SaltedTxidHasher>_>)
                       in_stack_fffffffffffffef8._M_cur);
    __first._M_cur = (__node_type *)iVar7.iter.super__Node_iterator_base<uint256,_true>._M_cur;
    iVar7 = std::
            transform<__gnu_cxx::__normal_iterator<CTxIn_const*,std::vector<CTxIn,std::allocator<CTxIn>>>,std::insert_iterator<std::unordered_set<uint256,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<uint256>>>,IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                      (cVar5._M_current,cVar6._M_current,iVar7.container,__first._M_cur);
    __pred.input_txids = iVar7.container;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffffee0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffee0);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator-((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                (difference_type)in_stack_fffffffffffffee0);
    local_59 = std::
               all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,IsChildWithParents(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__2>
                         ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           )__first._M_cur,__last,__pred);
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::~unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                      *)in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool IsChildWithParents(const Package& package)
{
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));
    if (package.size() < 2) return false;

    // The package is expected to be sorted, so the last transaction is the child.
    const auto& child = package.back();
    std::unordered_set<uint256, SaltedTxidHasher> input_txids;
    std::transform(child->vin.cbegin(), child->vin.cend(),
                   std::inserter(input_txids, input_txids.end()),
                   [](const auto& input) { return input.prevout.hash; });

    // Every transaction must be a parent of the last transaction in the package.
    return std::all_of(package.cbegin(), package.cend() - 1,
                       [&input_txids](const auto& ptx) { return input_txids.count(ptx->GetHash()) > 0; });
}